

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hxx
# Opt level: O0

XMLNodeAdapter * FileParse::operator<<(XMLNodeAdapter *node,Child<const_BSDFData::Length> *child)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  bool bVar1;
  __sv_type name;
  XMLNodeAdapter local_68;
  reference local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nodeName;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  XMLNodeAdapter childNode;
  Child<const_BSDFData::Length> *child_local;
  XMLNodeAdapter *node_local;
  
  childNode.pimpl_.super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)child;
  XMLNodeAdapter::XMLNodeAdapter((XMLNodeAdapter *)&__range2,node);
  this._M_pi = childNode.pimpl_.super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  __end0 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)childNode.pimpl_.
                      super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  nodeName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this._M_pi);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&__end0,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&nodeName);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end0);
    name = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    XMLNodeAdapter::addChild(&local_68,(XMLNodeAdapter *)&__range2,name);
    XMLNodeAdapter::operator=((XMLNodeAdapter *)&__range2,&local_68);
    XMLNodeAdapter::~XMLNodeAdapter(&local_68);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end0);
  }
  BSDFData::operator<<
            ((XMLNodeAdapter *)&__range2,
             *(Length **)
              &childNode.pimpl_.super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi[1]._M_use_count);
  XMLNodeAdapter::~XMLNodeAdapter((XMLNodeAdapter *)&__range2);
  return node;
}

Assistant:

inline NodeAdapter & operator<<(NodeAdapter & node, const Child<T> & child)
    {
        auto childNode = node;
        for(const auto & nodeName : child.nodeNames)
        {
            childNode = childNode.addChild(nodeName);
        }
        childNode << child.data;
        return node;
    }